

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void chan_writeb0(opl_channel *channel,Bit8u data)

{
  Bit8u data_local;
  opl_channel *channel_local;
  
  if ((channel->chip->newm == '\0') || (channel->chtype != '\x02')) {
    channel->f_num = channel->f_num & 0xff | (data & 3) << 8;
    channel->block = (byte)((int)(uint)data >> 2) & 7;
    channel->ksv = channel->block << 1 |
                   (byte)((int)(uint)channel->f_num >> (9 - channel->chip->nts & 0x1f)) & 1;
    envelope_update_ksl(channel->slots[0]);
    envelope_update_ksl(channel->slots[1]);
    envelope_update_rate(channel->slots[0]);
    envelope_update_rate(channel->slots[1]);
    if ((channel->chip->newm != '\0') && (channel->chtype == '\x01')) {
      channel->pair->f_num = channel->f_num;
      channel->pair->block = channel->block;
      channel->pair->ksv = channel->ksv;
      envelope_update_ksl(channel->pair->slots[0]);
      envelope_update_ksl(channel->pair->slots[1]);
      envelope_update_rate(channel->pair->slots[0]);
      envelope_update_rate(channel->pair->slots[1]);
    }
  }
  return;
}

Assistant:

void chan_writeb0(opl_channel *channel, Bit8u data) {
	if (channel->chip->newm && channel->chtype == ch_4op2) {
		return;
	}
	channel->f_num = (channel->f_num & 0xff) | ((data & 0x03) << 8);
	channel->block = (data >> 2) & 0x07;
	channel->ksv = (channel->block << 1) | ((channel->f_num >> (0x09 - channel->chip->nts)) & 0x01);
	envelope_update_ksl(channel->slots[0]);
	envelope_update_ksl(channel->slots[1]);
	envelope_update_rate(channel->slots[0]);
	envelope_update_rate(channel->slots[1]);
	if (channel->chip->newm && channel->chtype == ch_4op) {
		channel->pair->f_num = channel->f_num;
		channel->pair->block = channel->block;
		channel->pair->ksv = channel->ksv;
		envelope_update_ksl(channel->pair->slots[0]);
		envelope_update_ksl(channel->pair->slots[1]);
		envelope_update_rate(channel->pair->slots[0]);
		envelope_update_rate(channel->pair->slots[1]);
	}
}